

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpsr_write_arm(CPUARMState *env,uint32_t val,uint32_t mask,CPSRWriteType write_type)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  ulong local_28;
  uint32_t changed_daif;
  CPSRWriteType write_type_local;
  uint32_t mask_local;
  uint32_t val_local;
  CPUARMState *env_local;
  
  if ((mask & 0xf0000000) != 0) {
    env->ZF = (val ^ 0xffffffff) & 0x40000000;
    env->NF = val;
    env->CF = val >> 0x1d & 1;
    env->VF = (val & 0x10000000) << 3;
  }
  if ((mask & 0x8000000) != 0) {
    env->QF = (uint)((val & 0x8000000) != 0);
  }
  if ((mask & 0x20) != 0) {
    env->thumb = (uint)((val & 0x20) != 0);
  }
  if ((mask & 0x6000000) != 0) {
    env->condexec_bits = env->condexec_bits & 0xfffffffc;
    env->condexec_bits = val >> 0x19 & 3 | env->condexec_bits;
  }
  if ((mask & 0xfc00) != 0) {
    env->condexec_bits = env->condexec_bits & 3;
    env->condexec_bits = val >> 8 & 0xfc | env->condexec_bits;
  }
  if ((mask & 0xf0000) != 0) {
    env->GE = val >> 0x10 & 0xf;
  }
  changed_daif = mask;
  if (((((write_type != CPSRWriteByUnicorn) && (write_type != CPSRWriteRaw)) &&
       (iVar2 = arm_feature(env,0x1b), iVar2 == 0)) &&
      ((iVar2 = arm_feature(env,0x21), iVar2 != 0 && (iVar2 = arm_feature(env,0x20), iVar2 == 0))))
     && (_Var1 = arm_is_secure(env), !_Var1)) {
    uVar3 = ((uint)env->daif ^ val) & mask;
    if (((uVar3 & 0x100) != 0) && (((env->cp15).scr_el3 & 0x20) == 0)) {
      changed_daif = mask & 0xfffffeff;
    }
    if ((uVar3 & 0x40) != 0) {
      if (((env->cp15).scr_el3 & 0x10) == 0) {
        changed_daif = changed_daif & 0xffffffbf;
      }
      _Var1 = arm_is_secure(env);
      if ((!_Var1) || (_Var1 = arm_el_is_aa64(env,3), _Var1)) {
        local_28 = (env->cp15).field_2.field_0.sctlr_ns;
      }
      else {
        local_28 = (env->cp15).field_2.field_0.sctlr_s;
      }
      if (((local_28 & 0x8000000) != 0) && ((val & 0x40) != 0)) {
        changed_daif = changed_daif & 0xffffffbf;
      }
    }
  }
  env->daif = (ulong)(changed_daif & 0x1c0 ^ 0xffffffff) & env->daif;
  env->daif = (ulong)(val & 0x1c0 & changed_daif) | env->daif;
  write_type_local = val;
  if ((write_type != CPSRWriteRaw) && (((env->uncached_cpsr ^ val) & changed_daif & 0x1f) != 0)) {
    if ((env->uncached_cpsr & 0x1f) == 0x10) {
      if (write_type == CPSRWriteByUnicorn) {
        switch_mode(env,val & 0x1f);
      }
      else {
        changed_daif = changed_daif & 0xffffffe0;
      }
    }
    else {
      iVar2 = bad_mode_switch(env,val & 0x1f,write_type);
      if (iVar2 == 0) {
        switch_mode(env,val & 0x1f);
      }
      else {
        changed_daif = changed_daif & 0xffffffe0;
        if ((write_type != CPSRWriteByGDBStub) && (iVar2 = arm_feature(env,0x1b), iVar2 != 0)) {
          changed_daif = changed_daif | 0x100000;
          write_type_local = val | 0x100000;
        }
      }
    }
  }
  env->uncached_cpsr =
       env->uncached_cpsr & (changed_daif & 0x1f0021f ^ ~CPSRWriteByInstr) |
       write_type_local & changed_daif & 0x1f0021f;
  return;
}

Assistant:

void cpsr_write(CPUARMState *env, uint32_t val, uint32_t mask,
                CPSRWriteType write_type)
{
    uint32_t changed_daif;

    if (mask & CPSR_NZCV) {
        env->ZF = (~val) & CPSR_Z;
        env->NF = val;
        env->CF = (val >> 29) & 1;
        env->VF = (val << 3) & 0x80000000;
    }
    if (mask & CPSR_Q)
        env->QF = ((val & CPSR_Q) != 0);
    if (mask & CPSR_T)
        env->thumb = ((val & CPSR_T) != 0);
    if (mask & CPSR_IT_0_1) {
        env->condexec_bits &= ~3;
        env->condexec_bits |= (val >> 25) & 3;
    }
    if (mask & CPSR_IT_2_7) {
        env->condexec_bits &= 3;
        env->condexec_bits |= (val >> 8) & 0xfc;
    }
    if (mask & CPSR_GE) {
        env->GE = (val >> 16) & 0xf;
    }

    /* In a V7 implementation that includes the security extensions but does
     * not include Virtualization Extensions the SCR.FW and SCR.AW bits control
     * whether non-secure software is allowed to change the CPSR_F and CPSR_A
     * bits respectively.
     *
     * In a V8 implementation, it is permitted for privileged software to
     * change the CPSR A/F bits regardless of the SCR.AW/FW bits.
     */
    if (write_type != CPSRWriteByUnicorn &&
         write_type != CPSRWriteRaw && 
         !arm_feature(env, ARM_FEATURE_V8) &&
        arm_feature(env, ARM_FEATURE_EL3) &&
        !arm_feature(env, ARM_FEATURE_EL2) &&
        !arm_is_secure(env)) {

        changed_daif = (env->daif ^ val) & mask;

        if (changed_daif & CPSR_A) {
            /* Check to see if we are allowed to change the masking of async
             * abort exceptions from a non-secure state.
             */
            if (!(env->cp15.scr_el3 & SCR_AW)) {
                qemu_log_mask(LOG_GUEST_ERROR,
                              "Ignoring attempt to switch CPSR_A flag from "
                              "non-secure world with SCR.AW bit clear\n");
                mask &= ~CPSR_A;
            }
        }

        if (changed_daif & CPSR_F) {
            /* Check to see if we are allowed to change the masking of FIQ
             * exceptions from a non-secure state.
             */
            if (!(env->cp15.scr_el3 & SCR_FW)) {
                qemu_log_mask(LOG_GUEST_ERROR,
                              "Ignoring attempt to switch CPSR_F flag from "
                              "non-secure world with SCR.FW bit clear\n");
                mask &= ~CPSR_F;
            }

            /* Check whether non-maskable FIQ (NMFI) support is enabled.
             * If this bit is set software is not allowed to mask
             * FIQs, but is allowed to set CPSR_F to 0.
             */
            if ((A32_BANKED_CURRENT_REG_GET(env, sctlr) & SCTLR_NMFI) &&
                (val & CPSR_F)) {
                qemu_log_mask(LOG_GUEST_ERROR,
                              "Ignoring attempt to enable CPSR_F flag "
                              "(non-maskable FIQ [NMFI] support enabled)\n");
                mask &= ~CPSR_F;
            }
        }
    }

    env->daif &= ~(CPSR_AIF & mask);
    env->daif |= val & CPSR_AIF & mask;

    if (write_type != CPSRWriteRaw &&
        ((env->uncached_cpsr ^ val) & mask & CPSR_M)) {
        if ((env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_USR) {
            /* Note that we can only get here in USR mode if this is a
             * gdb stub write; for this case we follow the architectural
             * behaviour for guest writes in USR mode of ignoring an attempt
             * to switch mode. (Those are caught by translate.c for writes
             * triggered by guest instructions.)
             */
            // Unicorn: No, it can also be uc_reg_write, let user switch registers banks.
            if (write_type == CPSRWriteByUnicorn) {
                switch_mode(env, val & CPSR_M);
            } else {
                mask &= ~CPSR_M;
            }
        } else if (bad_mode_switch(env, val & CPSR_M, write_type)) {
            /* Attempt to switch to an invalid mode: this is UNPREDICTABLE in
             * v7, and has defined behaviour in v8:
             *  + leave CPSR.M untouched
             *  + allow changes to the other CPSR fields
             *  + set PSTATE.IL
             * For user changes via the GDB stub, we don't set PSTATE.IL,
             * as this would be unnecessarily harsh for a user error.
             */
            mask &= ~CPSR_M;
            if (write_type != CPSRWriteByGDBStub &&
                arm_feature(env, ARM_FEATURE_V8)) {
                mask |= CPSR_IL;
                val |= CPSR_IL;
            }
            qemu_log_mask(LOG_GUEST_ERROR,
                          "Illegal AArch32 mode switch attempt from %s to %s\n",
                          aarch32_mode_name(env->uncached_cpsr),
                          aarch32_mode_name(val));
        } else {
            qemu_log_mask(CPU_LOG_INT, "%s %s to %s PC 0x%" PRIx32 "\n",
                          write_type == CPSRWriteExceptionReturn ?
                          "Exception return from AArch32" :
                          "AArch32 mode switch from",
                          aarch32_mode_name(env->uncached_cpsr),
                          aarch32_mode_name(val), env->regs[15]);
            switch_mode(env, val & CPSR_M);
        }
    }
    mask &= ~CACHED_CPSR_BITS;
    env->uncached_cpsr = (env->uncached_cpsr & ~mask) | (val & mask);
}